

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alSourceUnqueueBuffers
               (CallerInfo *callerinfo,ALuint name,ALsizei nb,ALuint *origbufnames,ALuint *bufnames)

{
  char *pcVar1;
  char *pcVar2;
  int local_2c;
  ALsizei i;
  ALuint *bufnames_local;
  ALuint *origbufnames_local;
  ALsizei nb_local;
  ALuint name_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = sourceString(name);
  pcVar2 = ptrString(origbufnames);
  printf("(%s, %u, %s",pcVar1,(ulong)(uint)nb,pcVar2);
  if (origbufnames != (ALuint *)0x0) {
    printf(" {");
    for (local_2c = 0; local_2c < nb; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (0 < local_2c) {
        pcVar1 = ",";
      }
      pcVar2 = bufferString(bufnames[local_2c]);
      printf("%s %s",pcVar1,pcVar2);
    }
    pcVar1 = "";
    if (0 < nb) {
      pcVar1 = " ";
    }
    printf("%s}",pcVar1);
  }
  printf(")\n");
  return;
}

Assistant:

static void dump_alSourceUnqueueBuffers(CallerInfo *callerinfo, ALuint name, ALsizei nb, ALuint *origbufnames, ALuint *bufnames)
{
    ALsizei i;
    printf("(%s, %u, %s", sourceString(name), (uint) nb, ptrString(origbufnames));
    if (origbufnames) {
        printf(" {");
        for (i = 0; i < nb; i++) {
#pragma warning can overflow ioblob array
            printf("%s %s", i > 0 ? "," : "", bufferString(bufnames[i]));
        }
        printf("%s}", nb > 0 ? " " : "");
    }
    printf(")\n");
}